

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

bool __thiscall QDomNodeListPrivate::checkNode(QDomNodeListPrivate *this,QDomNodePrivate *p)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_RSI;
  long in_FS_OFFSET;
  QDomNodePrivate *in_stack_ffffffffffffffa8;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  bool local_3a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  local_3a = false;
  if (in_RSI != 0) {
    bVar3 = QDomNodePrivate::isElement((QDomNodePrivate *)0x10dfee);
    local_3a = false;
    if (bVar3) {
      bVar3 = QString::isNull((QString *)0x10e00e);
      if (bVar3) {
        QDomNodePrivate::nodeName(in_stack_ffffffffffffffa8);
        bVar2 = true;
        local_3a = ::operator==((QString *)
                                CONCAT17(in_stack_ffffffffffffffb7,
                                         CONCAT16(in_stack_ffffffffffffffb6,
                                                  CONCAT15(in_stack_ffffffffffffffb5,
                                                           in_stack_ffffffffffffffb0))),
                                (QString *)in_stack_ffffffffffffffa8);
      }
      else {
        bVar3 = ::operator==((QString *)
                             CONCAT17(in_stack_ffffffffffffffb7,
                                      CONCAT16(in_stack_ffffffffffffffb6,
                                               CONCAT15(in_stack_ffffffffffffffb5,
                                                        in_stack_ffffffffffffffb0))),
                             (QString *)in_stack_ffffffffffffffa8);
        local_3a = false;
        if (bVar3) {
          local_3a = ::operator==((QString *)
                                  CONCAT17(in_stack_ffffffffffffffb7,
                                           (uint7)CONCAT15(in_stack_ffffffffffffffb5,
                                                           in_stack_ffffffffffffffb0)),
                                  (QString *)in_stack_ffffffffffffffa8);
        }
      }
    }
  }
  if (bVar2) {
    QString::~QString((QString *)0x10e0b2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_3a;
}

Assistant:

bool QDomNodeListPrivate::checkNode(QDomNodePrivate *p) const
{
    return p && p->isElement() && (nsURI.isNull()
                                   ? p->nodeName() == tagname
                                   : p->name == tagname && p->namespaceURI == nsURI);
}